

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O1

aiMesh * __thiscall
Assimp::MMDImporter::CreateMesh(MMDImporter *this,PmxModel *pModel,int indexStart,int indexCount)

{
  pointer *ppaVar1;
  PmxBone *pPVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  PmxVertex *pPVar6;
  aiVector3D *paVar7;
  _Head_base<0UL,_pmx::PmxVertexSkinning_*,_false> _Var8;
  PmxBone *pPVar9;
  _Base_ptr p_Var10;
  aiVertexWeight aVar11;
  aiVertexWeight aVar12;
  aiVertexWeight aVar13;
  aiVertexWeight aVar14;
  aiVertexWeight aVar15;
  aiVertexWeight aVar16;
  aiVertexWeight aVar17;
  aiVertexWeight aVar18;
  aiVertexWeight aVar19;
  aiBone **ppaVar20;
  long lVar21;
  aiMesh *paVar22;
  ulong *puVar23;
  aiFace *paVar24;
  ulong uVar25;
  int *piVar26;
  aiVector3D *paVar27;
  mapped_type *pmVar28;
  aiBone *paVar29;
  _Base_ptr p_Var30;
  aiVertexWeight *__s;
  aiFace *paVar31;
  float *pfVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  long lVar36;
  _Rb_tree_header *p_Var37;
  iterator iVar38;
  ulong uVar39;
  PmxModel *pPVar40;
  _Rb_tree_header *p_Var41;
  ulong uVar42;
  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  bone_vertex_map;
  aiVertexWeight local_a0;
  aiBone **local_98;
  long local_90;
  PmxModel *local_88;
  ulong local_80;
  long local_78;
  aiMesh *local_70;
  long local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_60;
  
  local_90 = CONCAT44(local_90._4_4_,indexStart);
  local_88 = pModel;
  paVar22 = (aiMesh *)operator_new(0x520);
  paVar22->mPrimitiveTypes = 0;
  paVar22->mNumVertices = 0;
  paVar22->mNumFaces = 0;
  memset(&paVar22->mVertices,0,0xcc);
  paVar22->mBones = (aiBone **)0x0;
  paVar22->mMaterialIndex = 0;
  (paVar22->mName).length = 0;
  (paVar22->mName).data[0] = '\0';
  memset((paVar22->mName).data + 1,0x1b,0x3ff);
  paVar22->mNumAnimMeshes = 0;
  paVar22->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar22->mMethod = 0;
  (paVar22->mAABB).mMin.x = 0.0;
  (paVar22->mAABB).mMin.y = 0.0;
  (paVar22->mAABB).mMin.z = 0.0;
  (paVar22->mAABB).mMax.x = 0.0;
  (paVar22->mAABB).mMax.y = 0.0;
  (paVar22->mAABB).mMax.z = 0.0;
  paVar22->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar22->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar22->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar22->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar22->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar22->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar22->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar22->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar22->mNumUVComponents[0] = 0;
  paVar22->mNumUVComponents[1] = 0;
  paVar22->mNumUVComponents[2] = 0;
  paVar22->mNumUVComponents[3] = 0;
  paVar22->mNumUVComponents[4] = 0;
  paVar22->mNumUVComponents[5] = 0;
  paVar22->mNumUVComponents[6] = 0;
  paVar22->mNumUVComponents[7] = 0;
  paVar22->mColors[0] = (aiColor4D *)0x0;
  paVar22->mColors[1] = (aiColor4D *)0x0;
  paVar22->mColors[2] = (aiColor4D *)0x0;
  paVar22->mColors[3] = (aiColor4D *)0x0;
  paVar22->mColors[4] = (aiColor4D *)0x0;
  paVar22->mColors[5] = (aiColor4D *)0x0;
  paVar22->mColors[6] = (aiColor4D *)0x0;
  paVar22->mColors[7] = (aiColor4D *)0x0;
  paVar22->mNumVertices = indexCount;
  local_98 = (aiBone **)CONCAT44(local_98._4_4_,indexCount);
  uVar35 = indexCount / 3;
  uVar25 = (ulong)uVar35;
  paVar22->mNumFaces = uVar35;
  puVar23 = (ulong *)operator_new__(uVar25 * 0x10 + 8);
  *puVar23 = uVar25;
  paVar24 = (aiFace *)(puVar23 + 1);
  if (4 < indexCount + 2U) {
    paVar31 = paVar24;
    do {
      paVar31->mNumIndices = 0;
      paVar31->mIndices = (uint *)0x0;
      paVar31 = paVar31 + 1;
    } while (paVar31 != paVar24 + uVar25);
  }
  paVar22->mFaces = paVar24;
  if (4 < indexCount + 2U) {
    uVar25 = 1;
    if (1 < uVar35) {
      uVar25 = (ulong)uVar35;
    }
    lVar36 = 0;
    do {
      *(undefined4 *)(puVar23 + 1) = 3;
      piVar26 = (int *)operator_new__(0xc);
      iVar34 = (int)lVar36;
      *piVar26 = iVar34;
      piVar26[1] = iVar34 + 1;
      piVar26[2] = iVar34 + 2;
      puVar23[2] = (ulong)piVar26;
      lVar36 = lVar36 + 3;
      puVar23 = puVar23 + 2;
    } while (uVar25 * 3 != lVar36);
  }
  iVar34 = (int)local_98;
  uVar33 = (ulong)local_98 & 0xffffffff;
  uVar25 = uVar33 * 0xc;
  paVar27 = (aiVector3D *)operator_new__(uVar25);
  if (iVar34 != 0) {
    memset(paVar27,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar22->mVertices = paVar27;
  paVar27 = (aiVector3D *)operator_new__(uVar25);
  pPVar40 = local_88;
  if ((int)local_98 != 0) {
    memset(paVar27,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar22->mNormals = paVar27;
  paVar27 = (aiVector3D *)operator_new__(uVar25);
  if ((int)local_98 != 0) {
    memset(paVar27,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar22->mTextureCoords[0] = paVar27;
  paVar22->mNumUVComponents[0] = 2;
  uVar39 = (ulong)(pPVar40->setting).uv;
  local_80 = uVar33;
  if (uVar39 != 0) {
    uVar42 = 0;
    do {
      paVar27 = (aiVector3D *)operator_new__(uVar25);
      if ((int)local_98 != 0) {
        memset(paVar27,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar22->mTextureCoords[uVar42 + 1] = paVar27;
      paVar22->mNumUVComponents[uVar42 + 1] = 4;
      uVar42 = uVar42 + 1;
    } while (uVar39 != uVar42);
  }
  pPVar40 = local_88;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)local_98) {
    local_68 = (long)(int)local_90;
    uVar25 = 0;
    do {
      iVar34 = (pPVar40->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar25 + local_68];
      pPVar6 = (pPVar40->vertices)._M_t.
               super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
               super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl;
      paVar7 = paVar22->mVertices;
      fVar4 = pPVar6[iVar34].position[1];
      fVar3 = pPVar6[iVar34].position[2];
      paVar27 = paVar7 + uVar25;
      paVar27->x = pPVar6[iVar34].position[0];
      paVar27->y = fVar4;
      paVar7[uVar25].z = fVar3;
      paVar7 = paVar22->mNormals;
      fVar4 = pPVar6[iVar34].normal[1];
      fVar3 = pPVar6[iVar34].normal[2];
      paVar27 = paVar7 + uVar25;
      paVar27->x = pPVar6[iVar34].normal[0];
      paVar27->y = fVar4;
      paVar7[uVar25].z = fVar3;
      paVar27 = paVar22->mTextureCoords[0];
      paVar27[uVar25].x = pPVar6[iVar34].uv[0];
      paVar27[uVar25].y = pPVar6[iVar34].uv[1];
      if ((pPVar40->setting).uv != '\0') {
        pfVar32 = (float *)((long)(pPVar6[iVar34].uva + 1) + 4);
        uVar33 = 0;
        do {
          paVar27 = paVar22->mTextureCoords[uVar33 + 1];
          paVar27[uVar25].x = (*(float (*) [4])(pfVar32 + -1))[0];
          paVar27[uVar25].y = *pfVar32;
          uVar33 = uVar33 + 1;
          pfVar32 = pfVar32 + 4;
        } while (uVar33 < (pPVar40->setting).uv);
      }
      _Var8._M_head_impl =
           *(PmxVertexSkinning **)
            &pPVar6[iVar34].skinning._M_t.
             super___uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
      ;
      if ((tuple<pmx::PmxVertexSkinning_*,_std::default_delete<pmx::PmxVertexSkinning>_>)
          _Var8._M_head_impl == (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
        local_78 = 0;
        local_90 = 0;
        local_98 = (aiBone **)0x0;
        lVar36 = 0;
      }
      else {
        local_78 = __dynamic_cast(_Var8._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF1::typeinfo,0);
        local_90 = __dynamic_cast(_Var8._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF2::typeinfo,0);
        local_98 = (aiBone **)
                   __dynamic_cast(_Var8._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF4::typeinfo,0);
        lVar36 = __dynamic_cast(_Var8._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                &pmx::PmxVertexSkinningSDEF::typeinfo,0);
      }
      lVar21 = local_90;
      ppaVar20 = local_98;
      uVar35 = (uint)uVar25;
      switch(pPVar6[iVar34].skinning_type) {
      case BDEF1:
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(local_78 + 8));
        local_a0.mWeight = 1.0;
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current ==
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a0.mVertexId = uVar35;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        }
        else {
LAB_0069bec9:
          aVar19.mWeight = local_a0.mWeight;
          aVar19.mVertexId = uVar35;
          *iVar38._M_current = aVar19;
          ppaVar1 = &(pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_a0.mVertexId = uVar35;
        }
        break;
      case BDEF2:
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(local_90 + 8));
        local_a0.mWeight = *(float *)(lVar21 + 0x10);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current ==
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a0.mVertexId = uVar35;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        }
        else {
          aVar13.mWeight = local_a0.mWeight;
          aVar13.mVertexId = uVar35;
          *iVar38._M_current = aVar13;
          ppaVar1 = &(pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_a0.mVertexId = uVar35;
        }
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar21 + 0xc));
        local_a0.mWeight = 1.0 - *(float *)(lVar21 + 0x10);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current !=
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0069bec9;
        local_a0.mVertexId = uVar35;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
        _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        break;
      case BDEF4:
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)((long)local_98 + 8));
        local_a0.mWeight = *(float *)((long)ppaVar20 + 0x18);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current ==
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a0.mVertexId = uVar35;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        }
        else {
          aVar11.mWeight = local_a0.mWeight;
          aVar11.mVertexId = uVar35;
          *iVar38._M_current = aVar11;
          ppaVar1 = &(pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_a0.mVertexId = uVar35;
        }
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)((long)ppaVar20 + 0xc));
        local_a0.mWeight = *(float *)((long)ppaVar20 + 0x1c);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current ==
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a0.mVertexId = uVar35;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        }
        else {
          aVar16.mWeight = local_a0.mWeight;
          aVar16.mVertexId = uVar35;
          *iVar38._M_current = aVar16;
          ppaVar1 = &(pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_a0.mVertexId = uVar35;
        }
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)((long)ppaVar20 + 0x10));
        local_a0.mWeight = *(float *)((long)ppaVar20 + 0x20);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current ==
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a0.mVertexId = uVar35;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        }
        else {
          aVar18.mWeight = local_a0.mWeight;
          aVar18.mVertexId = uVar35;
          *iVar38._M_current = aVar18;
          ppaVar1 = &(pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_a0.mVertexId = uVar35;
        }
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)((long)ppaVar20 + 0x14));
        local_a0.mWeight = *(float *)((long)ppaVar20 + 0x24);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current !=
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0069bec9;
        local_a0.mVertexId = uVar35;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
        _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        break;
      case SDEF:
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar36 + 8));
        local_a0.mWeight = *(float *)(lVar36 + 0x10);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current ==
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a0.mVertexId = uVar35;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        }
        else {
          aVar12.mWeight = local_a0.mWeight;
          aVar12.mVertexId = uVar35;
          *iVar38._M_current = aVar12;
          ppaVar1 = &(pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_a0.mVertexId = uVar35;
        }
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar36 + 0xc));
        local_a0.mWeight = 1.0 - *(float *)(lVar36 + 0x10);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current !=
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0069bec9;
        local_a0.mVertexId = uVar35;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
        _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        break;
      case QDEF:
        if ((_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)_Var8._M_head_impl ==
            (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
          lVar36 = 0;
        }
        else {
          lVar36 = __dynamic_cast(_Var8._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningQDEF::typeinfo,0);
        }
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar36 + 8));
        local_a0.mWeight = *(float *)(lVar36 + 0x18);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current ==
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a0.mVertexId = uVar35;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        }
        else {
          aVar14.mWeight = local_a0.mWeight;
          aVar14.mVertexId = uVar35;
          *iVar38._M_current = aVar14;
          ppaVar1 = &(pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_a0.mVertexId = uVar35;
        }
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar36 + 0xc));
        local_a0.mWeight = *(float *)(lVar36 + 0x1c);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current ==
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a0.mVertexId = uVar35;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        }
        else {
          aVar15.mWeight = local_a0.mWeight;
          aVar15.mVertexId = uVar35;
          *iVar38._M_current = aVar15;
          ppaVar1 = &(pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_a0.mVertexId = uVar35;
        }
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar36 + 0x10));
        local_a0.mWeight = *(float *)(lVar36 + 0x20);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current ==
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a0.mVertexId = uVar35;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
        }
        else {
          aVar17.mWeight = local_a0.mWeight;
          aVar17.mVertexId = uVar35;
          *iVar38._M_current = aVar17;
          ppaVar1 = &(pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_a0.mVertexId = uVar35;
        }
        pmVar28 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar36 + 0x14));
        local_a0.mWeight = *(float *)(lVar36 + 0x24);
        iVar38._M_current =
             (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar38._M_current !=
            (pmVar28->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0069bec9;
        local_a0.mVertexId = uVar35;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
        _M_realloc_insert<aiVertexWeight>(pmVar28,iVar38,&local_a0);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != local_80);
  }
  uVar35 = pPVar40->bone_count;
  uVar25 = 0xffffffffffffffff;
  if (-1 < (long)(int)uVar35) {
    uVar25 = (long)(int)uVar35 * 8;
  }
  local_98 = (aiBone **)operator_new__(uVar25);
  paVar22->mNumBones = uVar35;
  paVar22->mBones = local_98;
  if (0 < pPVar40->bone_count) {
    lVar36 = 0;
    local_70 = paVar22;
    do {
      p_Var37 = &local_60._M_impl.super__Rb_tree_header;
      paVar29 = (aiBone *)operator_new(0x450);
      (paVar29->mName).length = 0;
      (paVar29->mName).data[0] = '\0';
      memset((paVar29->mName).data + 1,0x1b,0x3ff);
      paVar29->mNumWeights = 0;
      paVar29->mWeights = (aiVertexWeight *)0x0;
      (paVar29->mOffsetMatrix).a1 = 1.0;
      (paVar29->mOffsetMatrix).a2 = 0.0;
      (paVar29->mOffsetMatrix).a3 = 0.0;
      (paVar29->mOffsetMatrix).a4 = 0.0;
      (paVar29->mOffsetMatrix).b1 = 0.0;
      (paVar29->mOffsetMatrix).b2 = 1.0;
      (paVar29->mOffsetMatrix).b3 = 0.0;
      (paVar29->mOffsetMatrix).b4 = 0.0;
      (paVar29->mOffsetMatrix).c1 = 0.0;
      (paVar29->mOffsetMatrix).c2 = 0.0;
      (paVar29->mOffsetMatrix).c3 = 1.0;
      (paVar29->mOffsetMatrix).c4 = 0.0;
      (paVar29->mOffsetMatrix).d1 = 0.0;
      (paVar29->mOffsetMatrix).d2 = 0.0;
      (paVar29->mOffsetMatrix).d3 = 0.0;
      (paVar29->mOffsetMatrix).d4 = 1.0;
      pPVar9 = (pPVar40->bones)._M_t.
               super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
               super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
      pPVar2 = pPVar9 + lVar36;
      uVar25 = pPVar9[lVar36].bone_name._M_string_length;
      if (uVar25 < 0x400) {
        (paVar29->mName).length = (ai_uint32)uVar25;
        memcpy((paVar29->mName).data,(pPVar2->bone_name)._M_dataplus._M_p,uVar25);
        (paVar29->mName).data[uVar25] = '\0';
      }
      fVar3 = pPVar2->position[0];
      fVar4 = pPVar2->position[1];
      fVar5 = pPVar2->position[2];
      (paVar29->mOffsetMatrix).a1 = 1.0;
      (paVar29->mOffsetMatrix).a2 = 0.0;
      (paVar29->mOffsetMatrix).a3 = 0.0;
      (paVar29->mOffsetMatrix).a4 = 0.0;
      (paVar29->mOffsetMatrix).b1 = 0.0;
      (paVar29->mOffsetMatrix).b2 = 1.0;
      (paVar29->mOffsetMatrix).b3 = 0.0;
      (paVar29->mOffsetMatrix).b4 = 0.0;
      (paVar29->mOffsetMatrix).c1 = 0.0;
      (paVar29->mOffsetMatrix).c2 = 0.0;
      (paVar29->mOffsetMatrix).c3 = 1.0;
      (paVar29->mOffsetMatrix).c4 = 0.0;
      (paVar29->mOffsetMatrix).d1 = 0.0;
      (paVar29->mOffsetMatrix).d2 = 0.0;
      (paVar29->mOffsetMatrix).d3 = 0.0;
      (paVar29->mOffsetMatrix).d4 = 1.0;
      (paVar29->mOffsetMatrix).a4 = -fVar3;
      (paVar29->mOffsetMatrix).b4 = -fVar4;
      (paVar29->mOffsetMatrix).c4 = -fVar5;
      p_Var30 = &p_Var37->_M_header;
      for (p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var10 != (_Rb_tree_header *)0x0;
          p_Var10 = (&p_Var10->_M_left)[(int)*(size_t *)(p_Var10 + 1) < lVar36]) {
        if (lVar36 <= (int)*(size_t *)(p_Var10 + 1)) {
          p_Var30 = p_Var10;
        }
      }
      p_Var41 = p_Var37;
      if (((_Rb_tree_header *)p_Var30 != p_Var37) &&
         (p_Var41 = (_Rb_tree_header *)p_Var30,
         lVar36 < (int)((_Rb_tree_header *)p_Var30)->_M_node_count)) {
        p_Var41 = p_Var37;
      }
      if (p_Var41 != p_Var37) {
        uVar33 = *(long *)((long)(p_Var41 + 1) + 8) - *(long *)(p_Var41 + 1) >> 3;
        paVar29->mNumWeights = (uint)uVar33;
        uVar33 = uVar33 & 0xffffffff;
        uVar25 = uVar33 * 8;
        __s = (aiVertexWeight *)operator_new__(uVar25);
        if (uVar33 != 0) {
          memset(__s,0,uVar25);
        }
        paVar29->mWeights = __s;
        paVar22 = local_70;
        if (paVar29->mNumWeights != 0) {
          uVar25 = 0;
          do {
            paVar29->mWeights[uVar25] = *(aiVertexWeight *)(*(long *)(p_Var41 + 1) + uVar25 * 8);
            uVar25 = uVar25 + 1;
          } while (uVar25 < paVar29->mNumWeights);
        }
      }
      local_98[lVar36] = paVar29;
      lVar36 = lVar36 + 1;
      pPVar40 = local_88;
    } while (lVar36 < local_88->bone_count);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return paVar22;
}

Assistant:

aiMesh *MMDImporter::CreateMesh(const pmx::PmxModel *pModel,
                                const int indexStart, const int indexCount) {
  aiMesh *pMesh = new aiMesh;

  pMesh->mNumVertices = indexCount;

  pMesh->mNumFaces = indexCount / 3;
  pMesh->mFaces = new aiFace[pMesh->mNumFaces];

  const int numIndices = 3; // triangular face
  for (unsigned int index = 0; index < pMesh->mNumFaces; index++) {
    pMesh->mFaces[index].mNumIndices = numIndices;
    unsigned int *indices = new unsigned int[numIndices];
    indices[0] = numIndices * index;
    indices[1] = numIndices * index + 1;
    indices[2] = numIndices * index + 2;
    pMesh->mFaces[index].mIndices = indices;
  }

  pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
  pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNumUVComponents[0] = 2;

  // additional UVs
  for (int i = 1; i <= pModel->setting.uv; i++) {
    pMesh->mTextureCoords[i] = new aiVector3D[pMesh->mNumVertices];
    pMesh->mNumUVComponents[i] = 4;
  }

  map<int, vector<aiVertexWeight>> bone_vertex_map;

  // fill in contents and create bones
  for (int index = 0; index < indexCount; index++) {
    const pmx::PmxVertex *v =
        &pModel->vertices[pModel->indices[indexStart + index]];
    const float *position = v->position;
    pMesh->mVertices[index].Set(position[0], position[1], position[2]);
    const float *normal = v->normal;

    pMesh->mNormals[index].Set(normal[0], normal[1], normal[2]);
    pMesh->mTextureCoords[0][index].x = v->uv[0];
    pMesh->mTextureCoords[0][index].y = v->uv[1];

    for (int i = 1; i <= pModel->setting.uv; i++) {
      // TODO: wrong here? use quaternion transform?
      pMesh->mTextureCoords[i][index].x = v->uva[i][0];
      pMesh->mTextureCoords[i][index].y = v->uva[i][1];
    }

    // handle bone map
    const auto vsBDEF1_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF1 *>(v->skinning.get());
    const auto vsBDEF2_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF2 *>(v->skinning.get());
    const auto vsBDEF4_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF4 *>(v->skinning.get());
    const auto vsSDEF_ptr =
        dynamic_cast<pmx::PmxVertexSkinningSDEF *>(v->skinning.get());
    switch (v->skinning_type) {
    case pmx::PmxVertexSkinningType::BDEF1:
      bone_vertex_map[vsBDEF1_ptr->bone_index].push_back(
          aiVertexWeight(index, 1.0));
      break;
    case pmx::PmxVertexSkinningType::BDEF2:
      bone_vertex_map[vsBDEF2_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF2_ptr->bone_weight));
      bone_vertex_map[vsBDEF2_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsBDEF2_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::BDEF4:
      bone_vertex_map[vsBDEF4_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight1));
      bone_vertex_map[vsBDEF4_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight2));
      bone_vertex_map[vsBDEF4_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight3));
      bone_vertex_map[vsBDEF4_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight4));
      break;
    case pmx::PmxVertexSkinningType::SDEF: // TODO: how to use sdef_c, sdef_r0,
                                           // sdef_r1?
      bone_vertex_map[vsSDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsSDEF_ptr->bone_weight));
      bone_vertex_map[vsSDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsSDEF_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::QDEF:
      const auto vsQDEF_ptr =
          dynamic_cast<pmx::PmxVertexSkinningQDEF *>(v->skinning.get());
      bone_vertex_map[vsQDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight1));
      bone_vertex_map[vsQDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight2));
      bone_vertex_map[vsQDEF_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight3));
      bone_vertex_map[vsQDEF_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight4));
      break;
    }
  }

  // make all bones for each mesh
  // assign bone weights to skinned bones (otherwise just initialize)
  auto bone_ptr_ptr = new aiBone *[pModel->bone_count];
  pMesh->mNumBones = pModel->bone_count;
  pMesh->mBones = bone_ptr_ptr;
  for (auto ii = 0; ii < pModel->bone_count; ++ii) {
    auto pBone = new aiBone;
    const auto &pmxBone = pModel->bones[ii];
    pBone->mName = pmxBone.bone_name;
    aiVector3D pos(pmxBone.position[0], pmxBone.position[1], pmxBone.position[2]);
    aiMatrix4x4::Translation(-pos, pBone->mOffsetMatrix);
    auto it = bone_vertex_map.find(ii);
    if (it != bone_vertex_map.end()) {
      pBone->mNumWeights = static_cast<unsigned int>(it->second.size());
      pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
      for (unsigned int j = 0; j < pBone->mNumWeights; j++) {
          pBone->mWeights[j] = it->second[j];
      }
    }
    bone_ptr_ptr[ii] = pBone;
  }

  return pMesh;
}